

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Instr * __thiscall
GlobOpt::ToVar(GlobOpt *this,Instr *instr,RegOpnd *regOpnd,BasicBlock *block,Value *value,
              bool needsUpdate)

{
  StackSym *this_00;
  Opnd *this_01;
  BasicBlock *pBVar1;
  code *pcVar2;
  undefined4 uVar3;
  BasicBlock *pBVar4;
  bool bVar5;
  BOOLEAN BVar6;
  OpndKind OVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar8;
  StackSym *pSVar9;
  undefined7 extraout_var;
  GlobOptBlockData *this_02;
  undefined7 extraout_var_00;
  IntConstOpnd *this_03;
  Instr *pIVar10;
  JITTimeFunctionBody *this_04;
  FunctionJITTimeInfo *this_05;
  SymOpnd *this_06;
  PropertySymOpnd *this_07;
  Func *func;
  long lVar11;
  Instr *afterThisInstr;
  Func **ppFVar12;
  OpCode opcode;
  undefined7 in_register_00000089;
  IRType type;
  GlobOpt *this_08;
  int local_78;
  undefined4 local_74;
  int32 intConstantValue;
  StackSym *local_68;
  Value *local_60;
  GlobOptBlockData *local_58;
  RegOpnd *local_50;
  undefined8 local_48;
  BasicBlock *local_40;
  undefined8 local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000089,needsUpdate);
  this_00 = regOpnd->m_sym;
  local_40 = block;
  bVar5 = IsTypeSpecPhaseOff(this->func);
  if (bVar5) {
    return instr;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              ((local_40->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
    return instr;
  }
  _intConstantValue = this;
  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                    ((local_40->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
  if (BVar6 != '\0') {
    return instr;
  }
  if (this_00->m_type != TyVar) {
    if ((this_00->field_0x1a & 1) == 0) {
      return instr;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c73,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
    if (bVar5) {
      *puVar8 = 0;
      return instr;
    }
    goto LAB_0043d6bc;
  }
  local_58 = &local_40->globOptData;
  bVar5 = GlobOptBlockData::IsTypeSpecialized(local_58,&this_00->super_Sym);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c78,"(block->globOptData.IsTypeSpecialized(varSym))",
                       "block->globOptData.IsTypeSpecialized(varSym)");
    if (!bVar5) goto LAB_0043d6bc;
    *puVar8 = 0;
  }
  this_08 = _intConstantValue;
  local_50 = regOpnd;
  if ((value == (Value *)0x0) &&
     (value = GlobOptBlockData::FindValue(local_58,&this_00->super_Sym), value == (Value *)0x0)) {
    local_38 = (Instr *)CONCAT44(local_38._4_4_,1);
    this_02 = (GlobOptBlockData *)0x0;
    local_60 = (Value *)0x0;
  }
  else {
    this_02 = (GlobOptBlockData *)value->valueInfo;
    local_60 = value;
    if (this_02 == (GlobOptBlockData *)0x0) {
      local_38 = (Instr *)CONCAT44(local_38._4_4_,1);
      this_02 = (GlobOptBlockData *)0x0;
    }
    else {
      bVar5 = ValueType::IsInt((ValueType *)&this_02->exprToValueMap);
      if (bVar5) {
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((local_40->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id);
      }
      local_38 = (Instr *)((ulong)local_38._4_4_ << 0x20);
    }
  }
  pBVar1 = local_40;
  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                    ((local_40->globOptData).liveInt32Syms,(this_00->super_Sym).m_id);
  if ((BVar6 == '\0') ||
     (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((pBVar1->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id),
     BVar6 != '\0')) {
    BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((pBVar1->globOptData).liveFloat64Syms,(this_00->super_Sym).m_id);
    if (BVar6 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cb6,"((0))","UNREACHED");
      if (!bVar5) goto LAB_0043d6bc;
      local_68 = (StackSym *)0x0;
      local_48 = 0;
      type = TyIllegal;
      goto LAB_0043d28f;
    }
    local_68 = StackSym::GetFloat64EquivSym(this_00,this_08->func);
    local_68->field_0x1a = local_68->field_0x1a | 2;
    if ((char)local_38 == '\0') {
      bVar5 = ValueType::IsNumber((ValueType *)&this_02->exprToValueMap);
      if (bVar5) {
        type = TyFloat64;
        local_48 = 0;
        goto LAB_0043d29a;
      }
      this_02 = (GlobOptBlockData *)
                ValueInfo::SpecializeToFloat64((ValueInfo *)this_02,this_08->alloc);
      local_48 = 0;
      ChangeValueInfo(this_08,local_40,local_60,(ValueInfo *)this_02,false,false);
    }
    else {
      local_48 = 0;
      local_60 = NewGenericValue(this_08,(ValueType)0x108,(Opnd *)0x0);
      this_02 = (GlobOptBlockData *)local_60->valueInfo;
      GlobOptBlockData::SetValue(local_58,local_60,&this_00->super_Sym);
    }
    IR::Opnd::SetValueType
              (&local_50->super_Opnd,
               (ValueType)
               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(((ValueType *)&this_02->exprToValueMap)->field_0).field_0);
    type = TyFloat64;
  }
  else {
    pSVar9 = StackSym::GetInt32EquivSym(this_00,this_08->func);
    if ((char)local_38 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_38 = (Instr *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&local_38->_vptr_Instr = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c90,"(valueInfo)","valueInfo");
      if (!bVar5) goto LAB_0043d6bc;
      *(undefined4 *)&local_38->_vptr_Instr = 0;
    }
    bVar5 = ValueType::IsInt((ValueType *)&this_02->exprToValueMap);
    local_68 = pSVar9;
    if (bVar5) {
      type = TyInt32;
      local_48 = CONCAT71(extraout_var,1);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2c91,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar5) goto LAB_0043d6bc;
      type = TyInt32;
      local_48 = CONCAT71(extraout_var_00,1);
LAB_0043d28f:
      *puVar8 = 0;
      this_08 = _intConstantValue;
    }
LAB_0043d29a:
    if (this_02 == (GlobOptBlockData *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cb9,"(valueInfo)","valueInfo");
      if (!bVar5) goto LAB_0043d6bc;
      *puVar8 = 0;
      this_02 = (GlobOptBlockData *)0x0;
    }
  }
  local_58 = this_02;
  bVar5 = ValueInfo::TryGetIntConstantValue((ValueInfo *)this_02,&local_78,false);
  if (bVar5) {
    this_03 = IR::IntConstOpnd::New((long)local_78,TyInt32,instr->m_func,false);
    func = instr->m_func;
    opcode = LdC_A_I4;
  }
  else {
    this_03 = (IntConstOpnd *)IR::RegOpnd::New(local_68,type,instr->m_func);
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_03,true);
    func = instr->m_func;
    opcode = ToVar;
  }
  pIVar10 = IR::Instr::New(opcode,&local_50->super_Opnd,&this_03->super_Opnd,func);
  IR::Instr::SetByteCodeOffset(pIVar10,instr);
  this_01 = pIVar10->m_dst;
  local_38 = pIVar10;
  OVar7 = IR::Opnd::GetKind(this_01);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0043d6bc;
    *puVar8 = 0;
  }
  IR::Opnd::SetIsJITOptimizedReg(this_01,true);
  if ((char)local_48 == '\0') {
    valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 &(((ValueType *)&local_58->exprToValueMap)->field_0).field_0;
  }
  else {
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetTaggedInt();
  }
  pIVar10 = local_38;
  IR::Opnd::SetValueType(local_38->m_dst,(ValueType)valueType.field_0);
  IR::Opnd::SetValueType(pIVar10->m_src1,(ValueType)valueType.field_0);
  pBVar4 = local_40;
  pBVar1 = local_40->next;
  ppFVar12 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar12 = &local_40->func;
  }
  lVar11 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar11 = 0xd0;
  }
  afterThisInstr = instr->m_prev;
  if ((*(Instr **)((long)&(*ppFVar12)->m_alloc + lVar11) == instr) &&
     ((instr->m_kind == InstrKindBranch || (instr->m_opcode == BailTarget)))) {
    for (; afterThisInstr->m_opcode == ByteCodeUses; afterThisInstr = afterThisInstr->m_prev) {
    }
  }
  BasicBlock::InsertInstrAfter(local_40,pIVar10,afterThisInstr);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pBVar4->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
  this_04 = JITTimeWorkItem::GetJITFunctionBody(this_08->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_04);
  this_05 = JITTimeWorkItem::GetJITTimeInfo(this_08->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_05);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,sourceContextId,functionId);
  uVar3 = local_74;
  if (bVar5) {
    Output::Print(L"TRACE ");
    if (this_08->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this_08->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this_08->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    IR::Opnd::Dump(&local_50->super_Opnd);
    Output::Print(L" : ");
    Output::Print(L"Converting to var\n");
    Output::Flush();
  }
  if (local_40->loop != (Loop *)0x0) {
    if (this_08->prePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2cef,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
      if (!bVar5) {
LAB_0043d6bc:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pIVar10 = local_38;
    }
    TryHoistInvariant(this_08,pIVar10,local_40,local_60,local_60,(Value *)0x0,false,false,false,
                      BailOutInvalid);
  }
  if ((char)uVar3 != '\0') {
    ProcessKills(this_08,pIVar10);
    ValueNumberObjectType(this_08,pIVar10->m_dst,pIVar10);
    if ((instr->m_src1 != (Opnd *)0x0) &&
       (OVar7 = IR::Opnd::GetKind(instr->m_src1), OVar7 == OpndKindSym)) {
      this_06 = IR::Opnd::AsSymOpnd(instr->m_src1);
      bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_06);
      if (bVar5) {
        this_07 = IR::Opnd::AsPropertySymOpnd(instr->m_src1);
        bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_07);
        if (bVar5) {
          IR::PropertySymOpnd::SetTypeChecked(this_07,false);
          IR::PropertySymOpnd::SetTypeAvailable(this_07,false);
          IR::PropertySymOpnd::SetWriteGuardChecked(this_07,false);
        }
        FinishOptPropOp(this_08,instr,this_07,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
        instr = SetTypeCheckBailOut(this_08,instr->m_src1,instr,(BailOutInfo *)0x0);
      }
    }
  }
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::ToVar(IR::Instr *instr, IR::RegOpnd *regOpnd, BasicBlock *block, Value *value, bool needsUpdate)
{
    IR::Instr *newInstr;
    StackSym *varSym = regOpnd->m_sym;

    if (IsTypeSpecPhaseOff(this->func))
    {
        return instr;
    }

    if (this->IsLoopPrePass())
    {
        block->globOptData.liveVarSyms->Set(varSym->m_id);
        return instr;
    }

    if (block->globOptData.liveVarSyms->Test(varSym->m_id))
    {
        // Already live, nothing to do
        return instr;
    }

    if (!varSym->IsVar())
    {
        Assert(!varSym->IsTypeSpec());
        // Leave non-vars alone.
        return instr;
    }

    Assert(block->globOptData.IsTypeSpecialized(varSym));

    if (!value)
    {
        value = block->globOptData.FindValue(varSym);
    }

    ValueInfo *valueInfo = value ? value->GetValueInfo() : nullptr;
    if(valueInfo && valueInfo->IsInt())
    {
        // If two syms have the same value, one is lossy-int-specialized, and then the other is int-specialized, the value
        // would have been updated to definitely int. Upon using the lossy-int-specialized sym later, it would be flagged as
        // lossy while the value is definitely int. Since the bit-vectors are based on the sym and not the value, update the
        // lossy state.
        block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id);
    }

    IRType fromType = TyIllegal;
    StackSym *typeSpecSym = nullptr;

    if (block->globOptData.liveInt32Syms->Test(varSym->m_id) && !block->globOptData.liveLossyInt32Syms->Test(varSym->m_id))
    {
        fromType = TyInt32;
        typeSpecSym = varSym->GetInt32EquivSym(this->func);
        Assert(valueInfo);
        Assert(valueInfo->IsInt());
    }
    else if (block->globOptData.liveFloat64Syms->Test(varSym->m_id))
    {

        fromType = TyFloat64;
        typeSpecSym = varSym->GetFloat64EquivSym(this->func);

        // Ensure that all bailout FromVars that generate a value for this type-specialized sym will bail out on any non-number
        // value, even ones that have already been generated before. Float-specialized non-number values cannot be converted
        // back to Var since they will not go back to the original non-number value. The dead-store pass will update the bailout
        // kind on already-generated FromVars based on this bit.
        typeSpecSym->m_requiresBailOnNotNumber = true;

        // A previous float conversion may have used BailOutPrimitiveButString, which does not change the value type to say
        // definitely float, since it can also be a non-string primitive. The convert back to Var though, will cause that
        // bailout kind to be changed to BailOutNumberOnly in the dead-store phase, so from the point of the initial conversion
        // to float, that the value is definitely number. Since we don't know where the FromVar is, change the value type here.
        if(valueInfo)
        {
            if(!valueInfo->IsNumber())
            {
                valueInfo = valueInfo->SpecializeToFloat64(alloc);
                ChangeValueInfo(block, value, valueInfo);
                regOpnd->SetValueType(valueInfo->Type());
            }
        }
        else
        {
            value = NewGenericValue(ValueType::Float);
            valueInfo = value->GetValueInfo();
            block->globOptData.SetValue(value, varSym);
            regOpnd->SetValueType(valueInfo->Type());
        }
    }
    else
    {
        Assert(UNREACHED);
    }

    AssertOrFailFast(valueInfo);

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        // Lower will tag or create a number directly
        newInstr = IR::Instr::New(Js::OpCode::LdC_A_I4, regOpnd,
            IR::IntConstOpnd::New(intConstantValue, TyInt32, instr->m_func), instr->m_func);
    }
    else
    {
        IR::RegOpnd * regNew = IR::RegOpnd::New(typeSpecSym, fromType, instr->m_func);
        Js::OpCode opcode = Js::OpCode::ToVar;
        regNew->SetIsJITOptimizedReg(true);

        newInstr = IR::Instr::New(opcode, regOpnd, regNew, instr->m_func);
    }
    newInstr->SetByteCodeOffset(instr);
    newInstr->GetDst()->AsRegOpnd()->SetIsJITOptimizedReg(true);

    ValueType valueType = valueInfo->Type();
    if(fromType == TyInt32)
    {
    #if !INT32VAR // All 32-bit ints are taggable on 64-bit architectures
        IntConstantBounds constantBounds;
        AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
        if(constantBounds.IsTaggable())
    #endif
        {
            // The value is within the taggable range, so set the opnd value types to TaggedInt to avoid the overflow check
            valueType = ValueType::GetTaggedInt();
        }
    }
    newInstr->GetDst()->SetValueType(valueType);
    newInstr->GetSrc1()->SetValueType(valueType);

    IR::Instr *insertAfterInstr = instr->m_prev;
    if (instr == block->GetLastInstr() &&
        (instr->IsBranchInstr() || instr->m_opcode == Js::OpCode::BailTarget))
    {
        // Don't insert code between the branch and the preceding ByteCodeUses instrs...
        while(insertAfterInstr->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertAfterInstr = insertAfterInstr->m_prev;
        }
    }
    block->InsertInstrAfter(newInstr, insertAfterInstr);

    block->globOptData.liveVarSyms->Set(varSym->m_id);

    GOPT_TRACE_OPND(regOpnd, _u("Converting to var\n"));

    if (block->loop)
    {
        Assert(!this->IsLoopPrePass());
        this->TryHoistInvariant(newInstr, block, value, value, nullptr, false);
    }

    if (needsUpdate)
    {
        // Make sure that the kill effect of the ToVar instruction is tracked and that the kill of a property
        // type is reflected in the current instruction.
        this->ProcessKills(newInstr);
        this->ValueNumberObjectType(newInstr->GetDst(), newInstr);

        if (instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
        {
            // Reprocess the load source. We need to reset the PropertySymOpnd fields first.
            IR::PropertySymOpnd *propertySymOpnd = instr->GetSrc1()->AsPropertySymOpnd();
            if (propertySymOpnd->IsTypeCheckSeqCandidate())
            {
                propertySymOpnd->SetTypeChecked(false);
                propertySymOpnd->SetTypeAvailable(false);
                propertySymOpnd->SetWriteGuardChecked(false);
            }

            this->FinishOptPropOp(instr, propertySymOpnd);
            instr = this->SetTypeCheckBailOut(instr->GetSrc1(), instr, nullptr);
        }
    }

    return instr;
}